

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_char,_3U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<unsigned_char,_3U> *this,uint32_t numChannels,uint32_t targetBits)

{
  byte bVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  uint32_t c;
  ulong uVar3;
  ulong uVar4;
  float *__src;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte *__dest;
  uint32_t x;
  uint uVar8;
  uint16_t outValue;
  float outValue_1;
  uint16_t local_58;
  allocator_type local_55;
  uint32_t local_54;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  float local_44;
  ulong local_40;
  ulong local_38;
  
  local_54 = numChannels;
  if (3 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<unsigned char, 3>::getSFloat(uint32_t, uint32_t) const [componentType = unsigned char, componentCount = 3]"
                 );
  }
  uVar6 = targetBits >> 3;
  local_50 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar6 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_55);
  uVar4 = (ulong)numChannels;
  uVar5 = 0;
  pvVar2 = local_50;
  local_40 = uVar4;
  do {
    if ((this->super_Image).height <= (uint)uVar5) {
      return pvVar2;
    }
    local_38 = uVar5;
    for (uVar8 = 0; uVar8 < (this->super_Image).width; uVar8 = uVar8 + 1) {
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        uVar7 = (this->super_Image).width * (int)uVar5 + uVar8;
        bVar1 = this->pixels[uVar7].field_0.comps[uVar3];
        __dest = (pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start + (uVar7 * local_54 + (int)uVar3) * uVar6;
        if (targetBits == 0x20) {
          local_44 = (float)bVar1;
          __src = &local_44;
LAB_001224cd:
          memcpy(__dest,__src,(ulong)uVar6);
          pvVar2 = local_50;
          uVar4 = local_40;
          uVar5 = local_38;
        }
        else {
          if (targetBits == 0x10) {
            local_58 = imageio::float_to_half((float)bVar1);
            __src = (float *)&local_58;
            goto LAB_001224cd;
          }
          if (targetBits == 8) {
            *__dest = bVar1;
          }
        }
      }
    }
    uVar5 = (ulong)((int)uVar5 + 1);
  } while( true );
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }